

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test::testBody
          (TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test *this)

{
  int iVar1;
  UtestShell *test;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  MockExpectedCallsListForTest expectations;
  MockUnexpectedCallHappenedFailure expectedFailure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"lazy");
  MockExpectedCallsListForTest::addFunction(&expectations,0,(SimpleString *)&expectedFailure);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            (&expectedFailure,test,&local_b0,&expectations.super_MockExpectedCallsList);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"lazy");
  (*pMVar2->_vptr_MockSupport[4])(pMVar2,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x24])(pMVar2);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"bar");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_90,"foo");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"bar1");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_90,"foo");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"bar2");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_90,"foo");
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
            ((long *)CONCAT44(extraout_var_01,iVar1),&local_90,1);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_b0,"");
  pMVar2 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"lazy");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_b0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x101);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsExceptForTheUnExpectedOne)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().ignoreOtherCalls();
    mock().actualCall("bar").withParameter("foo", 1);
    mock().actualCall("bar1").withParameter("foo", 1);
    mock().actualCall("bar2").withParameter("foo", 1);
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}